

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * __thiscall
ON_ManagedFonts::GetFromFontCharacteristics
          (ON_ManagedFonts *this,ON_Font *font_characteristics,bool bCreateIfNotFound)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Weight prefered_weight;
  Stretch prefered_stretch;
  Style prefered_style;
  uint uVar4;
  tuple<ON_Font_*,_std::default_delete<ON_Font>_> this_00;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  element_type *peVar7;
  ON_Font *this_01;
  double dVar8;
  bool local_23b;
  bool local_1eb;
  double local_1e8;
  ON_FontGlyphCache *font_glyph_cache;
  ON_FontMetrics *font_metrics;
  ON_MemoryAllocationTracking disable_tracking;
  ON_Font *temporary_font_1;
  _Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_> local_1b0;
  ON_Font *installed_font;
  uint managed_font_us_dev;
  uint managed_font_wss_dev;
  ON_Font undecorated;
  ON_Font *managed_font;
  undefined1 local_d0 [16];
  ON_wString local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  ON_wString name;
  NameLocale name_locale;
  ON_Font *temporary_font;
  byte local_71;
  undefined1 local_70 [24];
  undefined1 local_58 [19];
  bool bHaveName;
  unique_ptr<ON_Font,_std::default_delete<ON_Font>_> local_40;
  unique_ptr<ON_Font,_std::default_delete<ON_Font>_> fup;
  ON_Font *set_font_characteristics;
  double point_size;
  bool bIsStrikethrough;
  bool bIsUnderlined;
  bool bCreateIfNotFound_local;
  ON_Font *font_characteristics_local;
  ON_ManagedFonts *this_local;
  
  uVar4 = ON_FontList::Count(&this->m_managed_fonts);
  if (uVar4 == 0) {
    Internal_AddManagedFont(this,&ON_Font::Default,(ON_FontMetrics *)0x0);
  }
  bVar1 = ON_Font::IsManagedFont(font_characteristics);
  if (bVar1) {
    return font_characteristics;
  }
  bVar1 = ON_Font::IsUnderlined(font_characteristics);
  bVar2 = ON_Font::IsStrikethrough(font_characteristics);
  dVar8 = ON_Font::PointSize(font_characteristics);
  bVar3 = ON_Font::IsValidPointSize(dVar8);
  if (bVar3) {
    local_1e8 = ON_Font::PointSize(font_characteristics);
  }
  else {
    local_1e8 = 0.0;
  }
  fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
  super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
  super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
       (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
       (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)font_characteristics;
  std::unique_ptr<ON_Font,std::default_delete<ON_Font>>::
  unique_ptr<std::default_delete<ON_Font>,void>
            ((unique_ptr<ON_Font,std::default_delete<ON_Font>> *)&local_40);
  bVar3 = ON_Font::IsInstalledFont(font_characteristics);
  if (!bVar3) {
    local_70[0xf] = Unset;
    local_71 = 0;
    ON_Font::PostScriptName((ON_Font *)local_58);
    bVar3 = ON_wString::IsNotEmpty((ON_wString *)local_58);
    local_1eb = true;
    if (!bVar3) {
      ON_Font::WindowsLogfontName((ON_Font *)(local_70 + 0x10));
      local_70[0xf] = ManagedFont;
      bVar3 = ON_wString::IsNotEmpty((ON_wString *)(local_70 + 0x10));
      local_1eb = true;
      if (!bVar3) {
        ON_Font::FamilyName((ON_Font *)local_70);
        local_71 = 1;
        local_1eb = ON_wString::IsNotEmpty((ON_wString *)local_70);
      }
    }
    if ((local_71 & 1) != 0) {
      ON_wString::~ON_wString((ON_wString *)local_70);
    }
    if ((local_70[0xf] & ManagedFont) != Unset) {
      ON_wString::~ON_wString((ON_wString *)(local_70 + 0x10));
    }
    ON_wString::~ON_wString((ON_wString *)local_58);
    local_58[0xb] = local_1eb;
    if ((local_1eb == false) ||
       (bVar3 = ON_Font::HasUnsetProperties(font_characteristics,false,false), bVar3)) {
      std::make_unique<ON_Font,ON_Font_const&>((ON_Font *)&temporary_font);
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::operator=
                (&local_40,(unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&temporary_font);
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
                ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&temporary_font);
      this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
      super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>)
           std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::get(&local_40);
      if (this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
          super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl !=
          (_Head_base<0UL,_ON_Font_*,_false>)0x0) {
        if ((local_58[0xb] & 1) == 0) {
          ON_Font::operator=((ON_Font *)
                             this_00.
                             super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                             super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,&ON_Font::Default)
          ;
        }
        else {
          ON_Font::SetUnsetProperties
                    ((ON_Font *)
                     this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                     super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,&ON_Font::Default,true);
        }
        ON_Font::SetUnderlined
                  ((ON_Font *)
                   this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,bVar1);
        ON_Font::SetStrikethrough
                  ((ON_Font *)
                   this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,bVar2);
        ON_Font::SetPointSize
                  ((ON_Font *)
                   this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,local_1e8);
        fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
        super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
        super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
             (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
             (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
             this_00.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
             super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl;
      }
    }
    bVar3 = ON_Font::IsValid((ON_Font *)
                             fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>.
                             _M_t.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                             super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,(ON_TextLog *)0x0)
    ;
    if (!bVar3) {
      this_local = (ON_ManagedFonts *)&ON_Font::Default;
      name.m_s._4_4_ = 1;
      goto LAB_0061a7f8;
    }
  }
  name.m_s._3_1_ = 0;
  if ((!bVar1) && (!bVar2)) {
    if ((local_1e8 != 0.0) || (NAN(local_1e8))) {
      if ((local_1e8 != ON_Font::Default.m_point_size) ||
         (NAN(local_1e8) || NAN(ON_Font::Default.m_point_size))) goto LAB_0061a296;
    }
    bVar3 = ON_Font::EqualWeightStretchStyle
                      (&ON_Font::Default,
                       (ON_Font *)
                       fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                       super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                       super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,false);
    if (bVar3) {
      ON_Font::PostScriptName
                ((ON_Font *)local_98,
                 (NameLocale)
                 fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                 super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                 super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
      bVar3 = ON_wString::IsNotEmpty((ON_wString *)local_98);
      if (bVar3) {
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
        ON_Font::PostScriptName((ON_Font *)(local_a8 + 8),0x60);
        pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_a8 + 8));
        bVar3 = ON_wString::EqualOrdinal(pwVar5,pwVar6,true);
        ON_wString::~ON_wString((ON_wString *)(local_a8 + 8));
        if (bVar3) {
          this_local = (ON_ManagedFonts *)&ON_Font::Default;
          name.m_s._4_4_ = 1;
        }
        else {
          name.m_s._4_4_ = 2;
        }
      }
      else {
        ON_Font::WindowsLogfontName
                  ((ON_Font *)local_a8,
                   (NameLocale)
                   fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
        ON_wString::operator=((ON_wString *)local_98,(ON_wString *)local_a8);
        ON_wString::~ON_wString((ON_wString *)local_a8);
        bVar3 = ON_wString::IsNotEmpty((ON_wString *)local_98);
        if (bVar3) {
          pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
          ON_Font::WindowsLogfontName((ON_Font *)(local_b8 + 8),0x60);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_b8 + 8));
          bVar3 = ON_wString::EqualOrdinal(pwVar5,pwVar6,true);
          ON_wString::~ON_wString((ON_wString *)(local_b8 + 8));
          if (bVar3) {
            this_local = (ON_ManagedFonts *)&ON_Font::Default;
            name.m_s._4_4_ = 1;
          }
          else {
            name.m_s._4_4_ = 2;
          }
        }
        else {
          ON_Font::FamilyName((ON_Font *)local_b8,
                              (NameLocale)
                              fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>
                              ._M_t.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>
                              .super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
          ON_wString::operator=((ON_wString *)local_98,(ON_wString *)local_b8);
          ON_wString::~ON_wString((ON_wString *)local_b8);
          bVar3 = ON_wString::IsNotEmpty((ON_wString *)local_98);
          if (bVar3) {
            pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
            ON_Font::FamilyName((ON_Font *)&local_c0,0x60);
            pwVar6 = ON_wString::operator_cast_to_wchar_t_(&local_c0);
            bVar3 = ON_wString::EqualOrdinal(pwVar5,pwVar6,true);
            ON_wString::~ON_wString(&local_c0);
            if (bVar3) {
              ON_Font::FaceName((ON_Font *)(local_d0 + 8),
                                (NameLocale)
                                fup._M_t.
                                super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                                super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                                super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
              ON_wString::operator=((ON_wString *)local_98,(ON_wString *)(local_d0 + 8));
              ON_wString::~ON_wString((ON_wString *)(local_d0 + 8));
              bVar3 = ON_wString::IsEmpty((ON_wString *)local_98);
              local_23b = true;
              if (!bVar3) {
                pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_98);
                ON_Font::FaceName((ON_Font *)local_d0,0x60);
                pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_d0);
                local_23b = ON_wString::EqualOrdinal(pwVar5,pwVar6,true);
                ON_wString::~ON_wString((ON_wString *)local_d0);
              }
              if (local_23b != false) {
                this_local = (ON_ManagedFonts *)&ON_Font::Default;
                name.m_s._4_4_ = 1;
                goto LAB_0061a269;
              }
            }
            name.m_s._4_4_ = 2;
          }
          else {
            name.m_s._4_4_ = 2;
          }
        }
      }
LAB_0061a269:
      ON_wString::~ON_wString((ON_wString *)local_98);
      if (name.m_s._4_4_ != 2) goto LAB_0061a7f8;
    }
  }
LAB_0061a296:
  undecorated.m_managed_installed_font_and_bits =
       (ON__UINT_PTR)
       ON_FontList::FromFontProperties
                 (&this->m_managed_fonts,
                  (ON_Font *)
                  fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                  super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                  super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,true,true,bVar1,bVar2,
                  local_1e8);
  if (((ON_Font *)undecorated.m_managed_installed_font_and_bits == (ON_Font *)0x0) &&
     ((bVar1 || (bVar2)))) {
    ON_Font::ON_Font((ON_Font *)&managed_font_us_dev,
                     (ON_Font *)
                     fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                     super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                     super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    ON_Font::SetUnderlined((ON_Font *)&managed_font_us_dev,false);
    ON_Font::SetStrikethrough((ON_Font *)&managed_font_us_dev,false);
    undecorated.m_managed_installed_font_and_bits =
         (ON__UINT_PTR)
         ON_FontList::FromFontProperties
                   (&this->m_managed_fonts,(ON_Font *)&managed_font_us_dev,true,true,false,false,
                    local_1e8);
    ON_Font::~ON_Font((ON_Font *)&managed_font_us_dev);
  }
  installed_font._4_4_ =
       ON_Font::WeightStretchStyleDeviation
                 ((ON_Font *)
                  fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                  super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                  super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,
                  (ON_Font *)undecorated.m_managed_installed_font_and_bits);
  installed_font._0_4_ =
       ON_Font::UnderlinedStrikethroughDeviation
                 ((ON_Font *)
                  fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                  super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                  super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,
                  (ON_Font *)undecorated.m_managed_installed_font_and_bits);
  if (((undecorated.m_managed_installed_font_and_bits != 0) && (installed_font._4_4_ == 0)) &&
     ((uint)installed_font == 0)) {
    dVar8 = ON_Font::PointSize((ON_Font *)undecorated.m_managed_installed_font_and_bits);
    if ((local_1e8 == dVar8) && (!NAN(local_1e8) && !NAN(dVar8))) {
      this_local = (ON_ManagedFonts *)undecorated.m_managed_installed_font_and_bits;
      name.m_s._4_4_ = 1;
      goto LAB_0061a7f8;
    }
  }
  bVar3 = ON_Font::IsInstalledFont
                    ((ON_Font *)
                     fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                     super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                     super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
  if ((!bVar3) &&
     (local_1b0.super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
           (_Head_base<0UL,_ON_Font_*,_false>)
           ON_FontList::FromFontProperties
                     (&this->m_installed_fonts,
                      (ON_Font *)
                      fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                      super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                      super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,true,true),
     local_1b0.super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl != (ON_Font *)0x0)) {
    fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
    super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
    super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
         (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
         (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
         local_1b0.super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl;
    if ((bVar1) || ((bVar2 || (0.0 < local_1e8)))) {
      std::make_unique<ON_Font,ON_Font_const&>((ON_Font *)&temporary_font_1);
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::operator=
                (&local_40,(unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&temporary_font_1);
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
                ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&temporary_font_1);
      disable_tracking =
           (ON_MemoryAllocationTracking)
           std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::get(&local_40);
      if (disable_tracking != (ON_MemoryAllocationTracking)0x0) {
        ON_Font::SetUnderlined((ON_Font *)disable_tracking,bVar1);
        ON_Font::SetStrikethrough((ON_Font *)disable_tracking,bVar2);
        ON_Font::SetPointSize((ON_Font *)disable_tracking,local_1e8);
        fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
        super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
        super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
             (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
             (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)disable_tracking;
      }
    }
    undecorated.m_managed_installed_font_and_bits =
         (ON__UINT_PTR)
         ON_FontList::FromFontProperties
                   (&this->m_managed_fonts,
                    (ON_Font *)
                    fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                    super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                    super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,true,true,bVar1,bVar2,
                    local_1e8);
    prefered_weight =
         ON_Font::FontWeight((ON_Font *)
                             fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>.
                             _M_t.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                             super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    prefered_stretch =
         ON_Font::FontStretch
                   ((ON_Font *)
                    fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                    super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                    super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    prefered_style =
         ON_Font::FontStyle((ON_Font *)
                            fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>.
                            _M_t.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                            super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    installed_font._4_4_ =
         ON_Font::WeightStretchStyleDeviation
                   (prefered_weight,prefered_stretch,prefered_style,
                    (ON_Font *)undecorated.m_managed_installed_font_and_bits);
    bVar1 = ON_Font::IsUnderlined
                      ((ON_Font *)
                       fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                       super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                       super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    bVar2 = ON_Font::IsStrikethrough
                      ((ON_Font *)
                       fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                       super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                       super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    installed_font._0_4_ =
         ON_Font::UnderlinedStrikethroughDeviation
                   (bVar1,bVar2,(ON_Font *)undecorated.m_managed_installed_font_and_bits);
    if (((undecorated.m_managed_installed_font_and_bits != 0) && (installed_font._4_4_ == 0)) &&
       ((uint)installed_font == 0)) {
      this_local = (ON_ManagedFonts *)undecorated.m_managed_installed_font_and_bits;
      name.m_s._4_4_ = 1;
      goto LAB_0061a7f8;
    }
  }
  if (bCreateIfNotFound) {
    ON_MemoryAllocationTracking::ON_MemoryAllocationTracking
              ((ON_MemoryAllocationTracking *)&font_metrics,false);
    font_glyph_cache = (ON_FontGlyphCache *)0x0;
    peVar7 = std::__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2> *)
                        ((long)fup._M_t.
                               super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                               super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                               super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl + 0xa0));
    if (peVar7 != (element_type *)0x0) {
      font_glyph_cache = (ON_FontGlyphCache *)&peVar7->m_font_unit_metrics;
    }
    this_01 = (ON_Font *)operator_new(0xc0);
    ON_Font::ON_Font(this_01,ManagedFont,
                     (ON_Font *)
                     fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                     super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                     super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl);
    this_local = (ON_ManagedFonts *)
                 Internal_AddManagedFont(this,this_01,(ON_FontMetrics *)font_glyph_cache);
    name.m_s._4_4_ = 1;
    undecorated.m_managed_installed_font_and_bits = (ON__UINT_PTR)this_local;
    ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking
              ((ON_MemoryAllocationTracking *)&font_metrics);
  }
  else {
    this_local = (ON_ManagedFonts *)0x0;
    name.m_s._4_4_ = 1;
  }
LAB_0061a7f8:
  std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr(&local_40);
  return (ON_Font *)this_local;
}

Assistant:

const ON_Font* ON_ManagedFonts::GetFromFontCharacteristics(
  const ON_Font& font_characteristics,
  bool bCreateIfNotFound
)
{
  if ( 0 == m_managed_fonts.Count() )
  {
    // Put ON_Font::Default as the first entry in this list.
    Internal_AddManagedFont( &ON_Font::Default, nullptr );
  }

  if (font_characteristics.IsManagedFont())
    return &font_characteristics;


  const bool bIsUnderlined = font_characteristics.IsUnderlined();
  const bool bIsStrikethrough = font_characteristics.IsStrikethrough();
  const double point_size
    = ON_Font::IsValidPointSize(font_characteristics.PointSize())
    ? font_characteristics.PointSize()
    : 0.0;

  const ON_Font* set_font_characteristics = &font_characteristics;

  std::unique_ptr< ON_Font > fup;
  if (false == font_characteristics.IsInstalledFont())
  {
    bool bHaveName
      = font_characteristics.PostScriptName().IsNotEmpty()
      || font_characteristics.WindowsLogfontName().IsNotEmpty()
      || font_characteristics.FamilyName().IsNotEmpty();
    if ( false == bHaveName || font_characteristics.HasUnsetProperties(false, false) )
    {
      fup = std::make_unique< ON_Font >(font_characteristics);
      ON_Font* temporary_font = fup.get();
      if (nullptr != temporary_font)
      {
        if (false == bHaveName)
        {
          *temporary_font = ON_Font::Default;
        }
        else
        {
          temporary_font->SetUnsetProperties(ON_Font::Default, true);
        }
        temporary_font->SetUnderlined(bIsUnderlined);
        temporary_font->SetStrikethrough(bIsStrikethrough);
        temporary_font->SetPointSize(point_size);
        set_font_characteristics = temporary_font;
      }
    }

    if (false == set_font_characteristics->IsValid())
      return &ON_Font::Default;
  }

  ON_Font::NameLocale name_locale = ON_Font::NameLocale::LocalizedFirst;

  for (;;)
  {
    // quick test for default font that occurs often enough to warrant the special checking
    if (bIsUnderlined)
      break;
    if (bIsStrikethrough)
      break;
    if (0.0 != point_size && point_size != ON_Font::Default.m_point_size)
      break;

    if (false == ON_Font::EqualWeightStretchStyle(&ON_Font::Default, set_font_characteristics, false))
      break; // there are multiple weight-stretch-style settings for the same family name and same LOGFONT.lfFaceName.

    ON_wString name = set_font_characteristics->PostScriptName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.PostScriptName(name_locale), true))
      {
        return &ON_Font::Default;
      }
      break; // Different PostScript names
    }

    name = set_font_characteristics->WindowsLogfontName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.WindowsLogfontName(name_locale), true))
      {
        return &ON_Font::Default;
      }
      break; // Different LOGFONT settings
    }

    name = set_font_characteristics->FamilyName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.FamilyName(name_locale), true))
      {
        name = set_font_characteristics->FaceName(name_locale);
        if (
          name.IsEmpty()
          || ON_wString::EqualOrdinal(name, ON_Font::Default.FaceName(name_locale), true)
          )
        {
          return &ON_Font::Default;
        }
      }
      break; // Different faces
    }

    break;
  }

  const ON_Font* managed_font = m_managed_fonts.FromFontProperties(
    set_font_characteristics,
    true,
    true,
    bIsUnderlined,
    bIsStrikethrough,
    point_size
    );

  if (nullptr == managed_font && (bIsUnderlined || bIsStrikethrough))
  {
    ON_Font undecorated(*set_font_characteristics);
    undecorated.SetUnderlined(false);
    undecorated.SetStrikethrough(false);
    managed_font = m_managed_fonts.FromFontProperties(
      &undecorated,
      true,
      true,
      false, // ignore bIsUnderlined
      false, // ignore bIsStrikethrough
      point_size
    );
  }

  unsigned int managed_font_wss_dev = ON_Font::WeightStretchStyleDeviation(
    set_font_characteristics, 
    managed_font
  );

  // Lowell - Added additional check for matching underline and strikethrough settings RH-60947
  unsigned int managed_font_us_dev = ON_Font::UnderlinedStrikethroughDeviation(
    set_font_characteristics, 
    managed_font
  );

  if (
    nullptr != managed_font 
    && 0 == managed_font_wss_dev
    && 0 == managed_font_us_dev
    && point_size == managed_font->PointSize()
    )
  {
    return managed_font;
  }


  for(;;)
  {
    if (set_font_characteristics->IsInstalledFont())
      break;

    const ON_Font* installed_font
      = m_installed_fonts.FromFontProperties(
        set_font_characteristics,
        true,
        true
      );
    if (nullptr == installed_font)
      break;

    set_font_characteristics = installed_font;
    if (bIsUnderlined || bIsStrikethrough || point_size > 0.0)
    {
      // Need a copy to set underlined/strikethrough/point_size
      fup = std::make_unique< ON_Font >(*installed_font);
      ON_Font* temporary_font = fup.get();
      if (nullptr != temporary_font)
      {
        temporary_font->SetUnderlined(bIsUnderlined);
        temporary_font->SetStrikethrough(bIsStrikethrough);
        temporary_font->SetPointSize(point_size);
        set_font_characteristics = temporary_font;
      }
    }

    // Look again now that we have settings known to be correct.
    managed_font = m_managed_fonts.FromFontProperties(
      set_font_characteristics,
      true,
      true,
      bIsUnderlined,
      bIsStrikethrough,
      point_size
      );

    managed_font_wss_dev = ON_Font::WeightStretchStyleDeviation(
      set_font_characteristics->FontWeight(), 
      set_font_characteristics->FontStretch(), 
      set_font_characteristics->FontStyle(), 
      managed_font
    );

    // RH - 60947
    managed_font_us_dev = ON_Font::UnderlinedStrikethroughDeviation(
      set_font_characteristics->IsUnderlined(),
      set_font_characteristics->IsStrikethrough(),
      managed_font
    );


    if (nullptr != managed_font 
      && 0 == managed_font_wss_dev
      && 0 == managed_font_us_dev
      )
      return managed_font;

    break;
  }

  if (false == bCreateIfNotFound)
    return nullptr;

  // The managed font constructor does not copy user data, m_font_index, m_font_id, m_gonna_change_font_cache
  ON_MemoryAllocationTracking disable_tracking(false);
  const ON_FontMetrics* font_metrics = nullptr;
  const ON_FontGlyphCache* font_glyph_cache = set_font_characteristics->m_font_glyph_cache.get();
  if (nullptr != font_glyph_cache)
    font_metrics = &font_glyph_cache->m_font_unit_metrics;
  managed_font = Internal_AddManagedFont(
    new ON_Font( ON_Font::FontType::ManagedFont, *set_font_characteristics),
    font_metrics
  );

  return managed_font;
}